

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fProgramInterfaceQueryTestCase.cpp
# Opt level: O2

void __thiscall
deqp::gles31::Functional::anon_unknown_0::TransformFeedbackTypeValidator::validateBuiltinVariable
          (TransformFeedbackTypeValidator *this,string *resource,GLint propValue,
          string *implementationName)

{
  ostringstream *poVar1;
  bool bVar2;
  DataType DVar3;
  char *pcVar4;
  allocator<char> local_1a1;
  undefined1 local_1a0 [384];
  
  bVar2 = std::operator==(resource,"gl_Position");
  local_1a0._0_8_ =
       ((this->super_TransformFeedbackResourceValidator).super_PropValidator.m_testCtx)->m_log;
  poVar1 = (ostringstream *)(local_1a0 + 8);
  std::__cxx11::ostringstream::ostringstream(poVar1);
  std::operator<<((ostream *)poVar1,"Verifying type, expecting ");
  pcVar4 = glu::getDataTypeName((uint)bVar2 << 2);
  std::operator<<((ostream *)poVar1,pcVar4);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_1a0,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(poVar1);
  DVar3 = glu::getDataTypeFromGLType(propValue);
  if (DVar3 != (uint)bVar2 << 2) {
    local_1a0._0_8_ =
         ((this->super_TransformFeedbackResourceValidator).super_PropValidator.m_testCtx)->m_log;
    poVar1 = (ostringstream *)(local_1a0 + 8);
    std::__cxx11::ostringstream::ostringstream(poVar1);
    std::operator<<((ostream *)poVar1,"\tError, got ");
    DVar3 = glu::getDataTypeFromGLType(propValue);
    pcVar4 = glu::getDataTypeName(DVar3);
    std::operator<<((ostream *)poVar1,pcVar4);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1a0,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(poVar1);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_1a0,"resource type invalid",&local_1a1);
    PropValidator::setError((PropValidator *)this,(string *)local_1a0);
    std::__cxx11::string::~string((string *)local_1a0);
  }
  return;
}

Assistant:

void TransformFeedbackTypeValidator::validateBuiltinVariable (const std::string& resource, glw::GLint propValue, const std::string& implementationName) const
{
	DE_UNREF(implementationName);

	glu::DataType varType = glu::TYPE_INVALID;

	if (resource == "gl_Position")
		varType = glu::TYPE_FLOAT_VEC4;
	else
		DE_ASSERT(false);

	m_testCtx.getLog() << tcu::TestLog::Message << "Verifying type, expecting " << glu::getDataTypeName(varType) << tcu::TestLog::EndMessage;
	if (glu::getDataTypeFromGLType(propValue) != varType)
	{
		m_testCtx.getLog() << tcu::TestLog::Message << "\tError, got " << glu::getDataTypeName(glu::getDataTypeFromGLType(propValue)) << tcu::TestLog::EndMessage;
		setError("resource type invalid");
	}
	return;
}